

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O2

void symhash_add(D_SymHash *sh,D_Sym *s)

{
  int iVar1;
  uint uVar2;
  D_Sym **ppDVar3;
  D_Sym *pDVar4;
  D_Sym **ppDVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  anon_struct_40_4_d8687ec6 tv;
  
  uVar7 = (ulong)(sh->syms).n;
  uVar8 = (ulong)s->hash % uVar7;
  ppDVar3 = (sh->syms).v;
  iVar1 = sh->index;
  sh->index = iVar1 + 1;
  s->next = ppDVar3[uVar8];
  ppDVar3[uVar8] = s;
  uVar2 = sh->grow;
  if ((int)uVar2 <= iVar1) {
    ppDVar3 = (sh->syms).v;
    (sh->syms).n = uVar2;
    sh->grow = uVar2 * 2 + 1;
    ppDVar5 = (D_Sym **)calloc(1,(ulong)uVar2 * 8);
    (sh->syms).v = ppDVar5;
    tv.n = 0;
    tv.v = (D_Sym **)0x0;
    for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
      while (pDVar4 = ppDVar3[uVar8], pDVar4 != (D_Sym *)0x0) {
        ppDVar3[uVar8] = pDVar4->next;
        if (tv.v == (D_Sym **)0x0) {
          uVar6 = (ulong)tv.n;
          tv.n = tv.n + 1;
          tv.e[uVar6] = pDVar4;
          tv.v = tv.e;
        }
        else {
          uVar6 = (ulong)tv.n;
          if (tv.v == tv.e) {
            if (2 < tv.n) goto LAB_0014502e;
LAB_00145024:
            tv.n = tv.n + 1;
            tv.v[uVar6] = pDVar4;
          }
          else {
            if ((tv.n & 7) != 0) goto LAB_00145024;
LAB_0014502e:
            vec_add_internal(&tv,pDVar4);
          }
        }
      }
    }
    while (pDVar4 = tv.v[uVar7], pDVar4 != (D_Sym *)0x0) {
      tv.v[uVar7] = pDVar4->next;
      uVar8 = (ulong)pDVar4->hash % (ulong)uVar2;
      pDVar4->next = ppDVar5[uVar8];
      ppDVar5[uVar8] = pDVar4;
    }
    free(ppDVar3);
  }
  return;
}

Assistant:

static void symhash_add(D_SymHash *sh, D_Sym *s) {
  uint i, h = s->hash % sh->syms.n, n;
  D_Sym **v = sh->syms.v, *x;
  Vec(D_Sym *) vv, tv;

  sh->index++;
  s->next = v[h];
  v[h] = s;

  if (sh->index > sh->grow) {
    vv.v = sh->syms.v;
    vv.n = sh->syms.n;
    sh->syms.n = sh->grow;
    sh->grow = sh->grow * 2 + 1;
    sh->syms.v = MALLOC(sh->syms.n * sizeof(void *));
    memset(sh->syms.v, 0, sh->syms.n * sizeof(void *));
    v = sh->syms.v;
    n = sh->syms.n;
    vec_clear(&tv);
    for (i = 0; i < vv.n; i++) /* use temporary to preserve order */
      while (vv.v[i]) {
        x = vv.v[i];
        vv.v[i] = x->next;
        vec_add(&tv, x);
      }
    while (tv.v[i]) {
      x = tv.v[i];
      tv.v[i] = x->next;
      h = x->hash % n;
      x->next = v[h];
      v[h] = x;
    }
    FREE(vv.v);
  }
}